

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

ssize_t value_size(value_t *value)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  ssize_t sStack_8;
  
  iVar1 = value->type;
  sVar3 = 4;
  switch(iVar1) {
  case 0x62:
  case 99:
    sStack_8 = 1;
    break;
  case 100:
    sStack_8 = 8;
    break;
  case 0x6d:
    return (ssize_t)(value->val).d;
  default:
    if (iVar1 == 0x43) {
      return 4;
    }
    if (iVar1 == 0x53) {
      return 4;
    }
    if (iVar1 == 0x55) {
      return 4;
    }
    if ((iVar1 == 0x73) || (iVar1 == 0x75)) {
      return 2;
    }
    if (iVar1 == 0x7a) {
      sVar2 = strlen((value->val).z);
      return sVar2;
    }
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
    fprintf(_stderr,"%s:value_size: invalid type \'%c\'\n",argv0);
    sVar3 = -1;
  case 0x66:
    return sVar3;
  }
  return sStack_8;
}

Assistant:

ssize_t
value_size(
    const value_t* value)
{
    switch (value->type) {
    case 'f':
        return sizeof(float);
    case 'd':
        return sizeof(double);
    case 'b':
        return sizeof(unsigned char);
    case 'c':
        return sizeof(char);
    case 'u':
        return sizeof(uint16_t);
    case 's':
        return sizeof(int16_t);
    case 'U':
        return sizeof(uint32_t);
    case 'S':
        return sizeof(int32_t);
    case 'C':
        return sizeof(uint32_t);
    case 'z':
        return strlen(value->val.z);
    case 'm':
        return value->val.m.length;
    default:
        fprintf(stderr, "%s:value_size: invalid type '%c'\n", argv0, value->type);
        return -1;
    }
}